

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb2Flow.c
# Opt level: O2

Vec_Ptr_t * Llb_ManCutSupps(Aig_Man_t *p,Vec_Ptr_t *vResult)

{
  Vec_Ptr_t *p_00;
  Vec_Ptr_t *pVVar1;
  Vec_Ptr_t *vUpper;
  int i;
  
  p_00 = Vec_PtrAlloc(100);
  pVVar1 = Vec_PtrAlloc(0);
  Vec_PtrPush(p_00,pVVar1);
  pVVar1 = (Vec_Ptr_t *)Vec_PtrEntry(vResult,0);
  i = 1;
  while( true ) {
    if (vResult->nSize <= i) break;
    vUpper = (Vec_Ptr_t *)Vec_PtrEntry(vResult,i);
    pVVar1 = Llb_ManCutSupp(p,pVVar1,vUpper);
    Vec_PtrPush(p_00,pVVar1);
    i = i + 1;
    pVVar1 = vUpper;
  }
  if (p_00->nSize == vResult->nSize) {
    return p_00;
  }
  __assert_fail("Vec_PtrSize(vSupps) == Vec_PtrSize(vResult)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/bdd/llb/llb2Flow.c"
                ,0x4a,"Vec_Ptr_t *Llb_ManCutSupps(Aig_Man_t *, Vec_Ptr_t *)");
}

Assistant:

Vec_Ptr_t * Llb_ManCutSupps( Aig_Man_t * p, Vec_Ptr_t * vResult )
{
    Vec_Ptr_t * vSupps, * vOne, * vLower, * vUpper;
    int i;
    vSupps = Vec_PtrAlloc( 100 );
    Vec_PtrPush( vSupps, Vec_PtrAlloc(0) );
    vLower = (Vec_Ptr_t *)Vec_PtrEntry( vResult, 0 );
    Vec_PtrForEachEntryStart( Vec_Ptr_t *, vResult, vUpper, i, 1 )
    {
        vOne  = Llb_ManCutSupp( p, vLower, vUpper );
        Vec_PtrPush( vSupps, vOne );
        vLower = vUpper;
    }
    assert( Vec_PtrSize(vSupps) == Vec_PtrSize(vResult) );
    return vSupps;
}